

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_job.h
# Opt level: O1

void __thiscall
r_exec::SaliencyPropagationJob::~SaliencyPropagationJob(SaliencyPropagationJob *this)

{
  _Object *p_Var1;
  
  (this->super_TimeJob).super__Object._vptr__Object =
       (_func_int **)&PTR__SaliencyPropagationJob_001c1468;
  p_Var1 = (this->object).object;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((p_Var1->refCount).super___atomic_base<long>._M_i < 1) {
      (*p_Var1->_vptr__Object[1])();
    }
  }
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT SaliencyPropagationJob:
    public TimeJob
{
public:
    core::P<r_code::Code> object;
    double sln_change;
    double source_sln_thr;
    SaliencyPropagationJob(r_code::Code *o, double sln_change, double source_sln_thr, uint64_t ijt);
    bool update();
    void report(int64_t lag) const;
}